

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpMessage<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint16_t type_card;
  uint32_t uVar3;
  bool bVar4;
  ushort uVar5;
  FieldEntry *entry;
  char *pcVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  void *x;
  uint *puVar7;
  MessageLite **ppMVar8;
  TcParseTableBase *table_00;
  MessageLite *msg_00;
  Nonnull<const_char_*> failure_msg;
  uint uVar9;
  int iVar10;
  Arena *arena;
  int iVar11;
  char *local_50 [2];
  void *local_40;
  ErrnoSaver local_34;
  
  entry = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  type_card = entry->type_card;
  uVar5 = type_card & 0x30;
  if (uVar5 == 0x20) {
    if ((type_card & 0x1c0) == 0x40) {
      pcVar6 = MpRepeatedMessageOrGroup<true,true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar6;
    }
    if ((type_card & 0x1c0) == 0) {
      pcVar6 = MpRepeatedMessageOrGroup<true,false>(msg,ptr,ctx,data,table,hasbits);
      return pcVar6;
    }
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_001d1492;
  }
  uVar9 = data.field_0._0_4_ & 7;
  if ((type_card & 0x1c0) == 0x40) {
    if (uVar9 != 3) goto LAB_001d1470;
  }
  else if (((type_card & 0x1c0) != 0) || (uVar9 != 2)) {
LAB_001d1470:
    UNRECOVERED_JUMPTABLE = table->fallback;
LAB_001d1492:
    pcVar6 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar6;
  }
  if (uVar5 == 0x30) {
    bVar4 = ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,
                        (ParseContext *)(ulong)uVar9,msg);
  }
  else {
    if (uVar5 == 0x10) {
      anon_unknown_105::SetHas(entry,msg);
    }
    bVar4 = false;
  }
  x = MaybeGetSplitBase(msg,true,table);
  if ((ulong)table->has_bits_offset != 0) {
    local_40 = x;
    puVar7 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar7 = *puVar7 | (uint)hasbits;
    x = local_40;
  }
  ppMVar8 = RefAt<google::protobuf::MessageLite*>(x,(ulong)entry->offset);
  table_00 = GetTableFromAux(type_card,
                             *(FieldAux *)
                              ((long)&table->has_bits_offset +
                              (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset));
  msg_00 = *ppMVar8;
  if ((bVar4 | msg_00 == (MessageLite *)0x0) == 1) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    msg_00 = ClassData::New(table_00->class_data,arena);
    *ppMVar8 = msg_00;
  }
  if ((type_card & 0x1c0) == 0x40) {
    iVar10 = ctx->depth_;
    iVar11 = iVar10 + -1;
    ctx->depth_ = iVar11;
    if (0 < iVar10) {
      iVar10 = ctx->group_depth_ + 1;
      ctx->group_depth_ = iVar10;
      pcVar6 = ParseLoopPreserveNone(msg_00,ptr,ctx,table_00);
      if (pcVar6 == (char *)0x0) {
LAB_001d15d4:
        uVar1 = ctx->depth_;
        uVar2 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar2 + -1;
        uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        if (uVar3 != data.field_0._0_4_) {
          return (char *)0x0;
        }
        return pcVar6;
      }
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar11,ctx->depth_,"old_depth == depth_");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar10,ctx->group_depth_,"old_group_depth == group_depth_");
        if (failure_msg == (Nullable<const_char_*>)0x0) goto LAB_001d15d4;
        iVar11 = 0x492;
      }
      else {
        iVar11 = 0x491;
      }
LAB_001d1701:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,iVar11,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_50);
    }
  }
  else {
    local_50[0] = ptr;
    ReadSize(local_50);
    if ((local_50[0] != (char *)0x0) && (0 < ctx->depth_)) {
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&local_34,(char *)ctx,(int)local_50[0]);
      iVar11 = ctx->depth_ + -1;
      ctx->depth_ = iVar11;
      if (local_50[0] != (char *)0x0) {
        pcVar6 = ParseLoopPreserveNone(*ppMVar8,local_50[0],ctx,table_00);
        if ((pcVar6 == (char *)0x0) ||
           (failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                    (iVar11,ctx->depth_,"old_depth == depth_"),
           failure_msg == (Nullable<const_char_*>)0x0)) {
          ctx->depth_ = ctx->depth_ + 1;
          local_50[0] = (char *)CONCAT44(local_50[0]._4_4_,local_34.saved_errno_);
          bVar4 = EpsCopyInputStream::PopLimit
                            (&ctx->super_EpsCopyInputStream,(LimitToken *)local_50);
          if (!bVar4) {
            return (char *)0x0;
          }
          return pcVar6;
        }
        iVar11 = 0x481;
        goto LAB_001d1701;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMessage(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    const uint16_t rep = type_card & field_layout::kRepMask;
    switch (rep) {
      case field_layout::kRepMessage:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, false>(
            PROTOBUF_TC_PARAM_PASS);
      case field_layout::kRepGroup:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, true>(
            PROTOBUF_TC_PARAM_PASS);
      default:
        PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;
  const uint16_t rep = type_card & field_layout::kRepMask;
  const bool is_group = rep == field_layout::kRepGroup;

  // Validate wiretype:
  switch (rep) {
    case field_layout::kRepMessage:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
        goto fallback;
      }
      break;
    case field_layout::kRepGroup:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
        goto fallback;
      }
      break;
    default: {
    fallback:
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  SyncHasbits(msg, hasbits, table);
  MessageLite*& field = RefAt<MessageLite*>(base, entry.offset);

  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));
  if (need_init || field == nullptr) {
    field = NewMessage(inner_table, msg->GetArena());
  }
  const auto inner_loop = [&](const char* ptr) {
    return ParseLoopPreserveNone(field, ptr, ctx, inner_table);
  };
  return is_group ? ctx->ParseGroupInlined(ptr, decoded_tag, inner_loop)
                  : ctx->ParseLengthDelimitedInlined(ptr, inner_loop);
}